

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::ExtensionSet::ParseField
          (ExtensionSet *this,uint64_t tag,char *ptr,MessageLite *extendee,
          InternalMetadata *metadata,ParseContext *ctx)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  int field_number;
  bool was_packed_on_wire;
  GeneratedExtensionFinder finder;
  ExtensionInfo extension;
  bool local_71;
  GeneratedExtensionFinder local_70;
  ExtensionInfo local_68;
  
  local_68.descriptor = (FieldDescriptor *)0x0;
  local_68.lazy_eager_verify_func = (LazyEagerVerifyFnType)0x0;
  local_68.field_6.enum_validity_check.func = (EnumValidityFuncWithArg *)0x0;
  local_68.field_6.enum_validity_check.arg = (void *)0x0;
  local_68.message = (MessageLite *)0x0;
  local_68.number = 0;
  local_68.type = '\0';
  local_68.is_repeated = false;
  local_68.is_packed = false;
  local_68.is_lazy = kUndefined;
  field_number = (int)(tag >> 3);
  local_70.extendee_ = extendee;
  bVar1 = FindExtensionInfoFromFieldNumber<google::protobuf::internal::GeneratedExtensionFinder>
                    (this,(uint)tag & 7,field_number,&local_70,&local_68,&local_71);
  if (bVar1) {
    pcVar2 = ParseFieldWithExtensionInfo<std::__cxx11::string>
                       (this,field_number,local_71,&local_68,metadata,ptr,ctx);
  }
  else {
    unknown = InternalMetadata::mutable_unknown_fields<std::__cxx11::string>(metadata);
    pcVar2 = UnknownFieldParse((uint)tag,unknown,ptr,ctx);
  }
  return pcVar2;
}

Assistant:

const char* ExtensionSet::ParseField(uint64_t tag, const char* ptr,
                                     const MessageLite* extendee,
                                     internal::InternalMetadata* metadata,
                                     internal::ParseContext* ctx) {
  GeneratedExtensionFinder finder(extendee);
  int number = tag >> 3;
  bool was_packed_on_wire;
  ExtensionInfo extension;
  if (!FindExtensionInfoFromFieldNumber(tag & 7, number, &finder, &extension,
                                        &was_packed_on_wire)) {
    return UnknownFieldParse(
        tag, metadata->mutable_unknown_fields<std::string>(), ptr, ctx);
  }
  return ParseFieldWithExtensionInfo<std::string>(
      number, was_packed_on_wire, extension, metadata, ptr, ctx);
}